

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

LoadFileStatus lf_load_fp(LoadedFile *lf,FILE *fp)

{
  int iVar1;
  LoadFileStatus LVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  lf->len = 0;
  uVar4 = lf->max_size;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      sVar3 = fread(lf->data + uVar5,1,uVar4 - uVar5,(FILE *)fp);
      iVar1 = ferror((FILE *)fp);
      if (iVar1 != 0) {
        return LF_ERROR;
      }
      uVar5 = lf->len;
      uVar4 = lf->max_size;
      if (sVar3 == 0) break;
      uVar5 = uVar5 + sVar3;
      lf->len = uVar5;
    } while (uVar5 < uVar4);
    LVar2 = LF_OK;
    if (uVar5 != uVar4) goto LAB_0010d9b3;
  }
  iVar1 = fgetc((FILE *)fp);
  LVar2 = (LoadFileStatus)(iVar1 != -1);
  uVar5 = lf->len;
LAB_0010d9b3:
  lf->binarysource_[0].data = lf->data;
  lf->binarysource_[0].len = uVar5;
  lf->binarysource_[0].pos = 0;
  lf->binarysource_[0].err = BSE_NO_ERROR;
  lf->binarysource_[0].binarysource_ = lf->binarysource_;
  return LVar2;
}

Assistant:

LoadFileStatus lf_load_fp(LoadedFile *lf, FILE *fp)
{
    lf->len = 0;
    while (lf->len < lf->max_size) {
        size_t retd = fread(lf->data + lf->len, 1, lf->max_size - lf->len, fp);
        if (ferror(fp))
            return LF_ERROR;

        if (retd == 0)
            break;

        lf->len += retd;
    }

    LoadFileStatus status = LF_OK;

    if (lf->len == lf->max_size) {
        /* The file might be too long to fit in our fixed-size
         * structure. Try reading one more byte, to check. */
        if (fgetc(fp) != EOF)
            status = LF_TOO_BIG;
    }

    BinarySource_INIT(lf, lf->data, lf->len);

    return status;
}